

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

CompilerHLSL * __thiscall
spirv_cross::CompilerHLSL::image_type_hlsl_modern_abi_cxx11_
          (CompilerHLSL *this,SPIRType *type,uint32_t id)

{
  uint32_t id_00;
  CompilerError *pCVar1;
  size_type sVar2;
  uint32_t in_ECX;
  undefined4 in_register_00000014;
  bool bVar3;
  byte local_1a9;
  bool local_189;
  bool local_142;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  spirv_cross local_120 [32];
  char *local_100;
  char *rw;
  char *ms;
  char *arrayed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [32];
  spirv_cross local_c0 [32];
  char *local_a0;
  char *rw_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [48];
  ID local_48;
  bool local_41;
  uint local_40;
  bool force_image_srv;
  uint32_t components;
  bool typed_load;
  char *dim;
  SPIRType *imagetype;
  long lStack_20;
  uint32_t id_local;
  SPIRType *type_local;
  CompilerHLSL *this_local;
  
  lStack_20 = CONCAT44(in_register_00000014,id);
  imagetype._4_4_ = in_ECX;
  type_local = type;
  this_local = this;
  id_00 = TypedID::operator_cast_to_unsigned_int((TypedID *)(lStack_20 + 0x108));
  dim = (char *)Compiler::get<spirv_cross::SPIRType>((Compiler *)type,id_00);
  _components = (char *)0x0;
  force_image_srv = false;
  local_40 = 4;
  local_142 = false;
  if (((ulong)type[0x1c].array.super_VectorView<unsigned_int>.ptr & 1) != 0) {
    TypedID<(spirv_cross::Types)0>::TypedID(&local_48,imagetype._4_4_);
    local_142 = Compiler::has_decoration((Compiler *)type,local_48,DecorationNonWritable);
  }
  local_41 = local_142;
  switch(*(undefined4 *)(lStack_20 + 0x10c)) {
  case 0:
    force_image_srv = *(int *)(lStack_20 + 0x114) == 2;
    _components = "1D";
    break;
  case 1:
    force_image_srv = *(int *)(lStack_20 + 0x114) == 2;
    _components = "2D";
    break;
  case 2:
    force_image_srv = *(int *)(lStack_20 + 0x114) == 2;
    _components = "3D";
    break;
  case 3:
    if (*(int *)(lStack_20 + 0x114) == 2) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar1,"RWTextureCube does not exist in HLSL.");
      __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    _components = "Cube";
    break;
  case 4:
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (pCVar1,"Rectangle texture support is not yet implemented for HLSL.");
    __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case 5:
    if (*(int *)(lStack_20 + 0x114) == 1) {
      (*(type->super_IVariant)._vptr_IVariant[0x13])(local_78,type,dim,0);
      join<char_const(&)[8],std::__cxx11::string,unsigned_int&,char_const(&)[2]>
                ((spirv_cross *)this,(char (*) [8])0x40d2da,local_78,&local_40,
                 (char (*) [2])0x4222ea);
      ::std::__cxx11::string::~string((string *)local_78);
      return this;
    }
    if (*(int *)(lStack_20 + 0x114) != 2) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar1,
                 "Sampler buffers must be either sampled or unsampled. Cannot deduce in runtime.");
      __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    sVar2 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)(type[8].member_type_index_redirection.stack_storage.aligned_char + 8),
                    (key_type *)((long)&imagetype + 4));
    if (sVar2 != 0) {
      image_format_to_type_abi_cxx11_
                ((ImageFormat)
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rw_1,
                 *(BaseType *)(lStack_20 + 0x118));
      join<char_const(&)[25],std::__cxx11::string,char_const(&)[2]>
                ((spirv_cross *)this,(char (*) [25])"RasterizerOrderedBuffer<",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rw_1,
                 (char (*) [2])0x4222ea);
      ::std::__cxx11::string::~string((string *)&rw_1);
      return this;
    }
    local_189 = false;
    if ((local_41 & 1U) == 0) {
      local_189 = *(int *)(lStack_20 + 0x114) == 2;
    }
    force_image_srv = local_189;
    local_a0 = "RW";
    if ((local_41 & 1U) != 0) {
      local_a0 = "";
    }
    arrayed._7_1_ = 0;
    if (local_189 == false) {
      (*(type->super_IVariant)._vptr_IVariant[0x13])(local_e0,type,dim,0);
      arrayed._7_1_ = 1;
      join<std::__cxx11::string,unsigned_int&>(local_c0,local_e0,&local_40);
    }
    else {
      image_format_to_type_abi_cxx11_((ImageFormat)local_c0,*(BaseType *)(lStack_20 + 0x118));
    }
    join<char_const*&,char_const(&)[8],std::__cxx11::string,char_const(&)[2]>
              ((spirv_cross *)this,&local_a0,(char (*) [8])0x40d2da,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
               (char (*) [2])0x4222ea);
    ::std::__cxx11::string::~string((string *)local_c0);
    if ((arrayed._7_1_ & 1) == 0) {
      return this;
    }
    ::std::__cxx11::string::~string((string *)local_e0);
    return this;
  case 6:
    _components = "2D";
    force_image_srv = false;
    break;
  default:
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar1,"Invalid dimension.");
    __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  ms = "";
  if ((*(byte *)(lStack_20 + 0x111) & 1) != 0) {
    ms = "Array";
  }
  rw = "";
  if ((*(byte *)(lStack_20 + 0x112) & 1) != 0) {
    rw = "MS";
  }
  local_1a9 = 0;
  if ((force_image_srv & 1U) != 0) {
    local_1a9 = local_142 ^ 0xff;
  }
  local_100 = "";
  if ((local_1a9 & 1) != 0) {
    local_100 = "RW";
  }
  if (local_142 != false) {
    force_image_srv = false;
  }
  if (((force_image_srv & 1U) != 0) &&
     (sVar2 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)(type[8].member_type_index_redirection.stack_storage.aligned_char + 8),
                      (key_type *)((long)&imagetype + 4)), sVar2 != 0)) {
    local_100 = "RasterizerOrdered";
  }
  bVar3 = (force_image_srv & 1U) == 0;
  if (bVar3) {
    (*(type->super_IVariant)._vptr_IVariant[0x13])(local_140,type,dim,0);
    join<std::__cxx11::string,unsigned_int&>(local_120,local_140,&local_40);
  }
  else {
    image_format_to_type_abi_cxx11_((ImageFormat)local_120,*(BaseType *)(lStack_20 + 0x118));
  }
  join<char_const*&,char_const(&)[8],char_const*&,char_const*&,char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
            ((spirv_cross *)this,&local_100,(char (*) [8])"Texture",(char **)&components,&rw,&ms,
             (char (*) [2])0x421795,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
             (char (*) [2])0x4222ea);
  ::std::__cxx11::string::~string((string *)local_120);
  if (bVar3) {
    ::std::__cxx11::string::~string((string *)local_140);
  }
  return this;
}

Assistant:

string CompilerHLSL::image_type_hlsl_modern(const SPIRType &type, uint32_t id)
{
	auto &imagetype = get<SPIRType>(type.image.type);
	const char *dim = nullptr;
	bool typed_load = false;
	uint32_t components = 4;

	bool force_image_srv = hlsl_options.nonwritable_uav_texture_as_srv && has_decoration(id, DecorationNonWritable);

	switch (type.image.dim)
	{
	case Dim1D:
		typed_load = type.image.sampled == 2;
		dim = "1D";
		break;
	case Dim2D:
		typed_load = type.image.sampled == 2;
		dim = "2D";
		break;
	case Dim3D:
		typed_load = type.image.sampled == 2;
		dim = "3D";
		break;
	case DimCube:
		if (type.image.sampled == 2)
			SPIRV_CROSS_THROW("RWTextureCube does not exist in HLSL.");
		dim = "Cube";
		break;
	case DimRect:
		SPIRV_CROSS_THROW("Rectangle texture support is not yet implemented for HLSL."); // TODO
	case DimBuffer:
		if (type.image.sampled == 1)
			return join("Buffer<", type_to_glsl(imagetype), components, ">");
		else if (type.image.sampled == 2)
		{
			if (interlocked_resources.count(id))
				return join("RasterizerOrderedBuffer<", image_format_to_type(type.image.format, imagetype.basetype),
				            ">");

			typed_load = !force_image_srv && type.image.sampled == 2;

			const char *rw = force_image_srv ? "" : "RW";
			return join(rw, "Buffer<",
			            typed_load ? image_format_to_type(type.image.format, imagetype.basetype) :
			                         join(type_to_glsl(imagetype), components),
			            ">");
		}
		else
			SPIRV_CROSS_THROW("Sampler buffers must be either sampled or unsampled. Cannot deduce in runtime.");
	case DimSubpassData:
		dim = "2D";
		typed_load = false;
		break;
	default:
		SPIRV_CROSS_THROW("Invalid dimension.");
	}
	const char *arrayed = type.image.arrayed ? "Array" : "";
	const char *ms = type.image.ms ? "MS" : "";
	const char *rw = typed_load && !force_image_srv ? "RW" : "";

	if (force_image_srv)
		typed_load = false;

	if (typed_load && interlocked_resources.count(id))
		rw = "RasterizerOrdered";

	return join(rw, "Texture", dim, ms, arrayed, "<",
	            typed_load ? image_format_to_type(type.image.format, imagetype.basetype) :
	                         join(type_to_glsl(imagetype), components),
	            ">");
}